

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

MoveMemFromConstCommand * __thiscall
AssemblyCode::MoveMemFromConstCommand::ToString_abi_cxx11_(MoveMemFromConstCommand *this)

{
  long in_RSI;
  __cxx11 local_c8 [48];
  CTemp local_98;
  string local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [40];
  MoveMemFromConstCommand *this_local;
  
  this_local = this;
  IRT::CTemp::ToString_abi_cxx11_(&local_98);
  std::operator+((char *)local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"mov ");
  std::operator+(local_58,(char *)local_78);
  std::__cxx11::to_string(local_c8,*(int *)(in_RSI + 0x28));
  std::operator+(local_38,local_58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return this;
}

Assistant:

std::string AssemblyCode::MoveMemFromConstCommand::ToString( ) const {
    return "mov " + target.ToString( ) + " [" + std::to_string( constant ) + "]\n";
}